

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * tinyusdz::to_string_abi_cxx11_(Extent e)

{
  ostream *poVar1;
  string *in_RDI;
  stringstream local_198 [8];
  stringstream ss;
  ostream aoStack_188 [384];
  
  ::std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = ::std::operator<<(aoStack_188,"[");
  poVar1 = ::std::operator<<(poVar1,(float3 *)&stack0x00000008);
  poVar1 = ::std::operator<<(poVar1,", ");
  poVar1 = ::std::operator<<(poVar1,(float3 *)(e.lower._M_elems + 1));
  ::std::operator<<(poVar1,"]");
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string to_string(tinyusdz::Extent e) {
  std::stringstream ss;

  ss << "[" << e.lower << ", " << e.upper << "]";

  return ss.str();
}